

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::operator+=(positionTy *this,positionTy *o)

{
  positionTy *o_local;
  positionTy *this_local;
  
  this->_lat = o->_lat + this->_lat;
  this->_lon = o->_lon + this->_lon;
  this->_alt = o->_alt + this->_alt;
  this->_ts = o->_ts + this->_ts;
  this->_head = o->_head + this->_head;
  this->_pitch = o->_pitch + this->_pitch;
  this->_roll = o->_roll + this->_roll;
  return this;
}

Assistant:

positionTy& positionTy::operator+= (const positionTy& o)
{
    _lat   += o._lat;
    _lon   += o._lon;
    _alt   += o._alt;
    _ts    += o._ts;
    _head  += o._head;
    _pitch += o._pitch;
    _roll  += o._roll;
    return *this;
}